

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O1

void frame_round(int x,int y,int w,int h,char *c,Fl_Color bc)

{
  Fl_Color FVar1;
  Fl_Color FVar2;
  uchar *puVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  
  uVar5 = (ulong)(uint)h;
  uVar7 = (ulong)(uint)x;
  puVar3 = fl_gray_ramp();
  FVar2 = (Fl_Color)c;
  if (w == h) {
    FVar1 = fl_color_average((uint)puVar3[0x49],FVar2,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              (0x4046800000000000,0x4060e00000000000,fl_graphics_driver,uVar7,y,(ulong)(uint)w,uVar5
              );
    FVar1 = fl_color_average((uint)puVar3[0x4a],FVar2,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              (0x4073b00000000000,0x4079500000000000,fl_graphics_driver,uVar7,y,(ulong)(uint)w,uVar5
              );
    FVar1 = fl_color_average((uint)puVar3[0x4c],FVar2,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              (0x406c200000000000,0x4073b00000000000,fl_graphics_driver,uVar7,y,(ulong)(uint)w,uVar5
              );
    FVar2 = fl_color_average((uint)puVar3[0x4d],FVar2,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar2);
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20];
    uVar5 = (ulong)(uint)w;
  }
  else {
    if (w <= h) {
      if (h <= w) {
        return;
      }
      uVar8 = (h + y) - w / 2;
      uVar6 = w / 2 + y;
      FVar1 = fl_color_average((uint)puVar3[0x49],FVar2,0.75);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar1);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x4046800000000000,0x4060e00000000000,fl_graphics_driver,uVar7,y,(ulong)(uint)w,
                 (ulong)(uint)w);
      FVar1 = fl_color_average((uint)puVar3[0x4a],FVar2,0.75);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar1);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0,0x4046800000000000,fl_graphics_driver,(ulong)(uint)x,y,(ulong)(uint)w,
                 (ulong)(uint)w);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                (fl_graphics_driver,(ulong)((w + x) - 1),(ulong)uVar6,(ulong)uVar8);
      uVar9 = (h + y) - w;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x4073b00000000000,0x4076800000000000,fl_graphics_driver,uVar7,(ulong)uVar9,
                 (ulong)(uint)w,(ulong)(uint)w);
      FVar1 = fl_color_average((uint)puVar3[0x4c],FVar2,0.75);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar1);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x406c200000000000,0x4073b00000000000,fl_graphics_driver,(ulong)(uint)x,
                 (ulong)uVar9,(ulong)(uint)w,(ulong)(uint)w);
      FVar2 = fl_color_average((uint)puVar3[0x4d],FVar2,0.75);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar2);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x4066800000000000,0x406c200000000000,fl_graphics_driver,(ulong)(uint)x,
                 (ulong)uVar9,(ulong)(uint)w,(ulong)(uint)w);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                (fl_graphics_driver,(ulong)(uint)x,(ulong)uVar6,(ulong)uVar8);
      UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20];
      uVar5 = (ulong)(uint)w;
      uVar7 = (ulong)(uint)w;
      uVar10 = 0x4066800000000000;
      goto LAB_0019ba7b;
    }
    iVar4 = (w + x) - h / 2;
    uVar6 = h / 2 + x;
    FVar1 = fl_color_average((uint)puVar3[0x49],FVar2,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              (0x4056800000000000,0x4060e00000000000,fl_graphics_driver,uVar7,y,uVar5,uVar5);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)uVar6,y,iVar4);
    uVar8 = (w + x) - h;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              (0x4046800000000000,0x4056800000000000,fl_graphics_driver,(ulong)uVar8,y,uVar5,uVar5);
    FVar1 = fl_color_average((uint)puVar3[0x4a],FVar2,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              (0x4073b00000000000,0x4079500000000000,fl_graphics_driver,(ulong)uVar8,y,uVar5,uVar5);
    FVar1 = fl_color_average((uint)puVar3[0x4c],FVar2,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              (0x4070e00000000000,0x4073b00000000000,fl_graphics_driver,(ulong)uVar8,y,uVar5,uVar5);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)uVar6,(ulong)((h + y) - 1),iVar4);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              (0x406c200000000000,0x4070e00000000000,fl_graphics_driver,uVar7,y,uVar5,uVar5);
    FVar2 = fl_color_average((uint)puVar3[0x4d],FVar2,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar2);
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20];
  }
  uVar7 = (ulong)(uint)h;
  uVar10 = 0x406c200000000000;
LAB_0019ba7b:
  (*UNRECOVERED_JUMPTABLE)
            (0x4060e00000000000,uVar10,fl_graphics_driver,(ulong)(uint)x,y,uVar5,uVar7);
  return;
}

Assistant:

static void frame_round(int x, int y, int w, int h, const char *c, Fl_Color bc) {
  const uchar *g = fl_gray_ramp();
  size_t b = strlen(c) / 4 + 1;

  if (w==h) {
    for (; b > 1; b --, x ++, y ++, w -= 2, h -= 2)
    {
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 45.0, 135.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 315.0, 405.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 225.0, 315.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 135.0, 225.0);
    }
  } else if (w>h) {
    int d = h/2;
    for (; b > 1; d--, b --, x ++, y ++, w -= 2, h -= 2)
    {
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, h, h, 90.0, 135.0);
      fl_xyline(x+d, y, x+w-d);
      fl_arc(x+w-h, y, h, h, 45.0, 90.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x+w-h, y, h, h, 315.0, 405.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x+w-h, y, h, h, 270.0, 315.0);
      fl_xyline(x+d, y+h-1, x+w-d);
      fl_arc(x, y, h, h, 225.0, 270.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, h, h, 135.0, 225.0);
    }
  } else if (w<h) {
    int d = w/2;
    for (; b > 1; d--, b --, x ++, y ++, w -= 2, h -= 2)
    {
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, w, 45.0, 135.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, w, 0.0, 45.0);
      fl_yxline(x+w-1, y+d, y+h-d);
      fl_arc(x, y+h-w, w, w, 315.0, 360.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y+h-w, w, w, 225.0, 315.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y+h-w, w, w, 180.0, 225.0);
      fl_yxline(x, y+d, y+h-d);
      fl_arc(x, y, w, w, 135.0, 180.0);
    }
  }
}